

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gaussian_mixture_modeling.cc
# Opt level: O2

void __thiscall
sptk::GaussianMixtureModeling::FloorVariance
          (GaussianMixtureModeling *this,
          vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *covariance_matrices
          )

{
  double dVar1;
  double *pdVar2;
  int l;
  int column;
  long lVar3;
  Row local_58;
  long local_40;
  double local_38;
  
  lVar3 = 0;
  while (lVar3 < this->num_mixture_) {
    local_40 = lVar3;
    for (column = 0; column <= this->num_order_; column = column + 1) {
      local_58.matrix_ =
           (covariance_matrices->
           super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>).
           _M_impl.super__Vector_impl_data._M_start + lVar3;
      local_58._vptr_Row = (_func_int **)&PTR__Row_0011eac0;
      local_58.row_ = column;
      pdVar2 = SymmetricMatrix::Row::operator[](&local_58,column);
      dVar1 = this->variance_floor_;
      if (*pdVar2 <= dVar1 && dVar1 != *pdVar2) {
        local_58.matrix_ =
             (covariance_matrices->
             super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>).
             _M_impl.super__Vector_impl_data._M_start + lVar3;
        local_58._vptr_Row = (_func_int **)&PTR__Row_0011eac0;
        local_58.row_ = column;
        local_38 = dVar1;
        pdVar2 = SymmetricMatrix::Row::operator[](&local_58,column);
        *pdVar2 = local_38;
      }
    }
    lVar3 = local_40 + 1;
  }
  return;
}

Assistant:

void GaussianMixtureModeling::FloorVariance(
    std::vector<SymmetricMatrix>* covariance_matrices) const {
  for (int k(0); k < num_mixture_; ++k) {
    for (int l(0); l <= num_order_; ++l) {
      if ((*covariance_matrices)[k][l][l] < variance_floor_) {
        (*covariance_matrices)[k][l][l] = variance_floor_;
      }
    }
  }
}